

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O2

void __thiscall
myvk::CommandBuffer::CmdBlitImage
          (CommandBuffer *this,Ptr<ImageView> *src_view,Ptr<ImageView> *dst_view,VkFilter filter)

{
  VkImageAspectFlags VVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  vector<VkImageBlit,_std::allocator<VkImageBlit>_> blits;
  value_type local_98;
  uint32_t local_48;
  uint32_t uStack_44;
  undefined8 uStack_40;
  
  blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar5 = (src_view->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar6 = (dst_view->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  VVar1 = (peVar6->m_subresource_range).aspectMask;
  local_48 = (peVar6->m_subresource_range).baseArrayLayer;
  uStack_44 = (peVar6->m_subresource_range).layerCount;
  uStack_40 = 0;
  peVar7 = (peVar5->m_image_ptr).super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar8 = (peVar6->m_image_ptr).super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  uVar2 = (peVar8->m_extent).width;
  uVar3 = (peVar8->m_extent).height;
  uVar4 = (peVar8->m_extent).depth;
  uVar9 = (peVar5->m_subresource_range).baseMipLevel;
  for (uVar12 = uVar9; uVar12 < uVar9 + (peVar5->m_subresource_range).levelCount;
      uVar12 = uVar12 + 1) {
    local_98.dstOffsets[0].x = 0;
    local_98.dstOffsets[0].y = 0;
    local_98.dstOffsets[0].z = 0;
    local_98.srcOffsets[0].x = 0;
    local_98.srcOffsets[0].y = 0;
    local_98.srcSubresource.aspectMask = (peVar5->m_subresource_range).aspectMask;
    local_98.srcSubresource.baseArrayLayer = (peVar5->m_subresource_range).baseArrayLayer;
    local_98.srcSubresource.layerCount = (peVar5->m_subresource_range).layerCount;
    local_98.dstSubresource.mipLevel = uVar12;
    local_98.dstSubresource.aspectMask = VVar1;
    local_98.dstSubresource.baseArrayLayer = local_48;
    local_98.dstSubresource.layerCount = uStack_44;
    bVar10 = (byte)uVar12;
    uVar13 = (peVar7->m_extent).width >> (bVar10 & 0x1f);
    uVar9 = (peVar7->m_extent).height >> (bVar10 & 0x1f);
    uVar11 = (peVar7->m_extent).depth >> (bVar10 & 0x1f);
    local_98.srcOffsets._8_8_ = (ulong)(uVar13 + (uVar13 == 0)) << 0x20;
    uVar13 = uVar2 >> (bVar10 & 0x1f);
    local_98.dstOffsets[1].x = uVar13 + (uVar13 == 0);
    uVar13 = uVar3 >> (bVar10 & 0x1f);
    local_98.dstOffsets[1].y = uVar13 + (uVar13 == 0);
    uVar13 = uVar4 >> (bVar10 & 0x1f);
    local_98.dstOffsets[1].z = uVar13 + (uVar13 == 0);
    local_98.srcOffsets[1].z = uVar11 + (uVar11 == 0);
    local_98.srcOffsets[1].y = uVar9 + (uVar9 == 0);
    local_98.srcSubresource.mipLevel = uVar12;
    std::vector<VkImageBlit,_std::allocator<VkImageBlit>_>::push_back(&blits,&local_98);
    uVar9 = (peVar5->m_subresource_range).baseMipLevel;
  }
  (*vkCmdBlitImage)(this->m_command_buffer,
                    ((((src_view->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_image_ptr).
                     super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    m_image,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                    ((((dst_view->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_image_ptr).
                     super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    m_image,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                    (uint32_t)
                    (((long)blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>.
                           _M_impl.super__Vector_impl_data._M_start) / 0x50),
                    blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>._M_impl.
                    super__Vector_impl_data._M_start,filter);
  std::_Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>::~_Vector_base
            (&blits.super__Vector_base<VkImageBlit,_std::allocator<VkImageBlit>_>);
  return;
}

Assistant:

void CommandBuffer::CmdBlitImage(const Ptr<ImageView> &src_view, const Ptr<ImageView> &dst_view,
                                 VkFilter filter) const {
	std::vector<VkImageBlit> blits;
	const auto &src_subres = src_view->GetSubresourceRange(), dst_subres = dst_view->GetSubresourceRange();
	const auto &src_extent = src_view->GetImagePtr()->GetExtent(), dst_extent = dst_view->GetImagePtr()->GetExtent();
	for (uint32_t i = src_subres.baseMipLevel; i < src_subres.baseMipLevel + src_subres.levelCount; ++i) {
		VkImageBlit blit = {};
		blit.srcSubresource = {src_subres.aspectMask, i, src_subres.baseArrayLayer, src_subres.layerCount};
		blit.dstSubresource = {dst_subres.aspectMask, i, dst_subres.baseArrayLayer, dst_subres.layerCount};
		blit.srcOffsets[1] = {
		    (int32_t)std::max(1u, src_extent.width >> i),
		    (int32_t)std::max(1u, src_extent.height >> i),
		    (int32_t)std::max(1u, src_extent.depth >> i),
		};
		blit.dstOffsets[1] = {
		    (int32_t)std::max(1u, dst_extent.width >> i),
		    (int32_t)std::max(1u, dst_extent.height >> i),
		    (int32_t)std::max(1u, dst_extent.depth >> i),
		};
		blits.push_back(blit);
	}
	vkCmdBlitImage(m_command_buffer, src_view->GetImagePtr()->GetHandle(), VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
	               dst_view->GetImagePtr()->GetHandle(), VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, blits.size(),
	               blits.data(), filter);
}